

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiColMod>::reserve(ImVector<ImGuiColMod> *this,int new_capacity)

{
  ImGuiColMod *__dest;
  value_type *new_data;
  int new_capacity_local;
  ImVector<ImGuiColMod> *this_local;
  
  if (this->Capacity < new_capacity) {
    __dest = (ImGuiColMod *)ImGui::MemAlloc((long)new_capacity * 0x14);
    if (this->Data != (ImGuiColMod *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size * 0x14);
      ImGui::MemFree(this->Data);
    }
    this->Data = __dest;
    this->Capacity = new_capacity;
  }
  return;
}

Assistant:

inline void         reserve(int new_capacity)
    {
        if (new_capacity <= Capacity)
            return;
        value_type* new_data = (value_type*)ImGui::MemAlloc((size_t)new_capacity * sizeof(value_type));
        if (Data)
        {
            memcpy(new_data, Data, (size_t)Size * sizeof(value_type));
            ImGui::MemFree(Data);
        }
        Data = new_data;
        Capacity = new_capacity;
    }